

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O1

void logical_or_vec(int n,int *vals,int *auxs,int *accum,int *accum_aux)

{
  ulong uVar1;
  
  *accum = 0x7ffffffe;
  if (0 < n) {
    uVar1 = 0;
    do {
      logical_or_combine_accum_help(vals[uVar1],accum);
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  *accum_aux = 0x7ffffffe;
  if (0 < n) {
    uVar1 = 0;
    do {
      logical_or_combine_accum_help(auxs[uVar1],accum_aux);
      uVar1 = uVar1 + 1;
    } while ((uint)n != uVar1);
  }
  return;
}

Assistant:

static void logical_or_vec(int n, const int *vals, const int *auxs,
	int *accum, int *accum_aux)
{
	int i;

	*accum = UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 0; i < n; ++i) {
		logical_or_combine_accum_help(vals[i], accum);
	}

	*accum_aux = UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 0; i < n; ++i) {
		logical_or_combine_accum_help(auxs[i], accum_aux);
	}
}